

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprCodeExprList(Parse *pParse,ExprList *pList,int target,int doHardCopy)

{
  int p1;
  ExprList_item *pEVar1;
  int iVar2;
  bool bVar3;
  
  p1 = pList->nExpr;
  pEVar1 = pList->a;
  iVar2 = 0;
  if (0 < p1) {
    iVar2 = p1;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    p1 = sqlite3ExprCodeTarget(pParse,pEVar1->pExpr,target);
    if (target != p1) {
      p1 = sqlite3VdbeAddOp2(pParse->pVdbe,(doHardCopy == 0) + 0xe,p1,target);
    }
    pEVar1 = pEVar1 + 1;
    target = target + 1;
  }
  return p1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeExprList(
  Parse *pParse,     /* Parsing context */
  ExprList *pList,   /* The expression list to be coded */
  int target,        /* Where to write results */
  int doHardCopy     /* Make a hard copy of every element */
){
  struct ExprList_item *pItem;
  int i, n;
  assert( pList!=0 );
  assert( target>0 );
  assert( pParse->pVdbe!=0 );  /* Never gets this far otherwise */
  n = pList->nExpr;
  for(pItem=pList->a, i=0; i<n; i++, pItem++){
    Expr *pExpr = pItem->pExpr;
    int inReg = sqlite3ExprCodeTarget(pParse, pExpr, target+i);
    if( inReg!=target+i ){
      sqlite3VdbeAddOp2(pParse->pVdbe, doHardCopy ? OP_Copy : OP_SCopy,
                        inReg, target+i);
    }
  }
  return n;
}